

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.hpp
# Opt level: O2

void __thiscall Excel::Record::Record(Record *this,Stream *stream)

{
  size_t in_RCX;
  void *__buf;
  
  this->m_code = 0;
  this->m_length = 0;
  RecordSubstream::RecordSubstream(&this->m_stream,stream->m_byteOrder);
  (this->m_borders).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_borders).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_borders).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  read(this,(int)stream,__buf,in_RCX);
  return;
}

Assistant:

inline
Record::Record( Stream & stream )
	:	m_code( 0 )
	,	m_length( 0 )
	,	m_stream( stream.byteOrder() )
{
	read( stream );
}